

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.cpp
# Opt level: O3

idx_t duckdb::Blob::FromBase64Size(string_t str)

{
  long lVar1;
  idx_t iVar2;
  ConversionException *this;
  undefined1 *in_RSI;
  uint in_EDI;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 auStack_3c [12];
  
  if (in_EDI < 0xd) {
    in_RSI = auStack_3c;
  }
  if ((in_EDI & 3) == 0) {
    if (in_EDI < 4) {
      iVar2 = 0;
    }
    else {
      lVar1 = (ulong)(in_EDI >> 2) * 3;
      if (in_RSI[(ulong)in_EDI - 2] == '=') {
        iVar2 = lVar1 - 2;
      }
      else {
        iVar2 = lVar1 - (ulong)(in_RSI[(ulong)in_EDI - 1] == '=');
      }
    }
    return iVar2;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,
             "Could not decode string \"%s\" as base64: length must be a multiple of 4","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,in_RSI,in_RSI + in_EDI);
  ConversionException::ConversionException<std::__cxx11::string>(this,&local_80,&local_60);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t Blob::FromBase64Size(string_t str) {
	auto input_data = str.GetData();
	auto input_size = str.GetSize();
	if (input_size % 4 != 0) {
		// valid base64 needs to always be cleanly divisible by 4
		throw ConversionException("Could not decode string \"%s\" as base64: length must be a multiple of 4",
		                          str.GetString());
	}
	if (input_size < 4) {
		// empty string
		return 0;
	}
	auto base_size = input_size / 4 * 3;
	// check for padding to figure out the length
	if (input_data[input_size - 2] == Blob::BASE64_PADDING) {
		// two bytes of padding
		return base_size - 2;
	}
	if (input_data[input_size - 1] == Blob::BASE64_PADDING) {
		// one byte of padding
		return base_size - 1;
	}
	// no padding
	return base_size;
}